

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generated_code.cc
# Opt level: O1

void __thiscall GeneratedCode_ArenaUnaligned_Test::TestBody(GeneratedCode_ArenaUnaligned_Test *this)

{
  upb_Arena *puVar1;
  pointer *__ptr;
  char *pcVar2;
  AssertionResult gtest_ar;
  char buf1 [1024];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_438;
  AssertHelper local_430;
  internal local_428 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_420;
  undefined1 local_411 [1017];
  
  puVar1 = upb_Arena_Init(local_411,(size_t)(&stack0xffffffffffffffe8 + -(long)local_411),
                          (upb_alloc *)0x0);
  pcVar2 = puVar1->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)pcVar2) < 8) {
    pcVar2 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,8);
  }
  else {
    if ((char *)((ulong)(pcVar2 + 7) & 0xfffffffffffffff8) != pcVar2) goto LAB_001a8f1d;
    puVar1->ptr_dont_copy_me__upb_internal_use_only = pcVar2 + 8;
  }
  local_430.data_._0_4_ = 0;
  local_438._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (ulong)((uint)pcVar2 & 7);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_428,"0","reinterpret_cast<uintptr_t>(mem) & low_bits",(int *)&local_430,
             (unsigned_long *)&local_438);
  if (local_428[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_438);
    if (local_420 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_420->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/test_generated_code.cc"
               ,0x352,pcVar2);
    testing::internal::AssertHelper::operator=(&local_430,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    if (local_438._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_438._M_head_impl + 8))();
    }
  }
  if (local_420 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_420,local_420);
  }
  upb_Arena_Free(puVar1);
  puVar1 = upb_Arena_Init(local_411,5,&upb_alloc_global);
  pcVar2 = puVar1->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)pcVar2) < 8) {
    pcVar2 = (char *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,8);
  }
  else {
    if ((char *)((ulong)(pcVar2 + 7) & 0xfffffffffffffff8) != pcVar2) {
LAB_001a8f1d:
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    puVar1->ptr_dont_copy_me__upb_internal_use_only = pcVar2 + 8;
  }
  local_430.data_._0_4_ = 0;
  local_438._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (ulong)((uint)pcVar2 & 7);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_428,"0","reinterpret_cast<uintptr_t>(mem) & low_bits",(int *)&local_430,
             (unsigned_long *)&local_438);
  if (local_428[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_438);
    if (local_420 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_420->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/test/test_generated_code.cc"
               ,0x358,pcVar2);
    testing::internal::AssertHelper::operator=(&local_430,(Message *)&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    if (local_438._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_438._M_head_impl + 8))();
    }
  }
  if (local_420 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_420,local_420);
  }
  upb_Arena_Free(puVar1);
  return;
}

Assistant:

TEST(GeneratedCode, ArenaUnaligned) {
  char buf1[1024];
  // Force the pointer to be unaligned.
  uintptr_t low_bits = UPB_MALLOC_ALIGN - 1;
  char* unaligned_buf_ptr = (char*)((uintptr_t)buf1 | low_bits);
  upb_Arena* arena = upb_Arena_Init(
      unaligned_buf_ptr, &buf1[sizeof(buf1)] - unaligned_buf_ptr, nullptr);
  char* mem = static_cast<char*>(upb_Arena_Malloc(arena, 5));
  EXPECT_EQ(0, reinterpret_cast<uintptr_t>(mem) & low_bits);
  upb_Arena_Free(arena);

  // Try the same, but with a size so small that aligning up will overflow.
  arena = upb_Arena_Init(unaligned_buf_ptr, 5, &upb_alloc_global);
  mem = static_cast<char*>(upb_Arena_Malloc(arena, 5));
  EXPECT_EQ(0, reinterpret_cast<uintptr_t>(mem) & low_bits);
  upb_Arena_Free(arena);
}